

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int nsPop(xmlParserCtxtPtr ctxt,int nr)

{
  xmlGenericErrorFunc p_Var1;
  uint in_EAX;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  ulong uVar4;
  uint uVar5;
  
  if (ctxt->nsTab != (xmlChar **)0x0) {
    in_EAX = ctxt->nsNr;
    if ((int)in_EAX < nr) {
      pp_Var2 = __xmlGenericError();
      p_Var1 = *pp_Var2;
      ppvVar3 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar3,"Pbm popping %d NS\n",nr);
      in_EAX = ctxt->nsNr;
      nr = in_EAX;
    }
    if (0 < nr && 0 < (int)in_EAX) {
      uVar4 = (ulong)in_EAX;
      uVar5 = 0;
      do {
        uVar4 = uVar4 - 1;
        ctxt->nsTab[uVar4] = (xmlChar *)0x0;
        uVar5 = uVar5 + 1;
      } while (nr != uVar5);
      in_EAX = in_EAX - uVar5;
      ctxt->nsNr = in_EAX;
    }
  }
  return in_EAX;
}

Assistant:

static int
nsPop(xmlParserCtxtPtr ctxt, int nr)
{
    int i;

    if (ctxt->nsTab == NULL) return(0);
    if (ctxt->nsNr < nr) {
        xmlGenericError(xmlGenericErrorContext, "Pbm popping %d NS\n", nr);
        nr = ctxt->nsNr;
    }
    if (ctxt->nsNr <= 0)
        return (0);

    for (i = 0;i < nr;i++) {
         ctxt->nsNr--;
	 ctxt->nsTab[ctxt->nsNr] = NULL;
    }
    return(nr);
}